

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::SliderCalcRatioFromValueT<int,float>
                (ImGuiDataType data_type,int v,int v_min,int v_max,float power,float linear_zero_pos
                )

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (v_max - v_min != 0) {
    iVar2 = v_max;
    if (v_min < v_max) {
      iVar2 = v_min;
    }
    iVar1 = v_max;
    if (v_max < v_min) {
      iVar1 = v_min;
    }
    if (v < iVar1) {
      iVar1 = v;
    }
    if (v < iVar2) {
      iVar1 = iVar2;
    }
    if (((data_type & 0xfffffffeU) == 4) && ((power != 1.0 || (NAN(power))))) {
      if (iVar1 < 0) {
        fVar3 = powf(1.0 - (float)((iVar1 - v_min) / ((v_max >> 0x1f & v_max) - v_min)),1.0 / power)
        ;
        fVar3 = (1.0 - fVar3) * linear_zero_pos;
      }
      else {
        iVar2 = 0;
        if (0 < v_min) {
          iVar2 = v_min;
        }
        fVar3 = powf((float)((iVar1 - iVar2) / (v_max - iVar2)),1.0 / power);
        fVar3 = fVar3 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
    }
    else {
      fVar3 = (float)(iVar1 - v_min) / (float)(v_max - v_min);
    }
  }
  return fVar3;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}